

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.cpp
# Opt level: O0

void __thiscall Al::internal::ProgressEngine::engine(ProgressEngine *this)

{
  bool bVar1;
  int iVar2;
  atomic<unsigned_long> *paVar3;
  reference this_00;
  size_type sVar4;
  size_type sVar5;
  undefined8 uVar6;
  reference ppAVar7;
  socklen_t in_ECX;
  sockaddr *in_RDX;
  int in_ESI;
  ProgressEngine *in_RDI;
  pair<std::__detail::_Node_iterator<std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>,_false,_false>,_bool>
  pVar8;
  AlState *req_2;
  iterator i_2;
  PEAction action;
  AlState *req_1;
  iterator i_1;
  size_t stage;
  array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>
  *pipeline;
  pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>
  *stream_pipeline_pair;
  iterator __end3;
  iterator __begin3;
  unordered_map<void_*,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>_>_>
  *__range3;
  bool do_start;
  AlState *req;
  size_t i;
  size_t cur_input_streams;
  unique_lock<std::mutex> lock;
  memory_order __b;
  unordered_map<void_*,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>_>_>
  *in_stack_fffffffffffffda8;
  unique_lock<std::mutex> *in_stack_fffffffffffffdb0;
  atomic<bool> *in_stack_fffffffffffffdb8;
  unordered_map<void_*,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>_>_>
  *in_stack_fffffffffffffdc0;
  const_iterator in_stack_fffffffffffffdc8;
  const_iterator __position;
  undefined4 in_stack_fffffffffffffdd8;
  int in_stack_fffffffffffffddc;
  allocator<char> *in_stack_fffffffffffffde0;
  undefined7 in_stack_fffffffffffffde8;
  undefined1 in_stack_fffffffffffffdef;
  _Node_iterator_base<std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>,_false>
  in_stack_fffffffffffffdf0;
  undefined8 *local_1f0;
  __normal_iterator<Al::internal::AlState_**,_std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>_>
  local_190;
  undefined1 local_182;
  int in_stack_fffffffffffffe8c;
  string *in_stack_fffffffffffffe90;
  string *in_stack_fffffffffffffe98;
  al_exception *in_stack_fffffffffffffea0;
  __normal_iterator<Al::internal::AlState_**,_std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>_>
  local_100;
  ulong local_f8;
  array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>
  *local_f0;
  reference local_e8;
  _Node_iterator_base<std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>,_false>
  local_e0;
  _Node_iterator_base<std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>,_false>
  local_d8;
  unordered_map<void_*,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>_>_>
  *local_d0;
  undefined8 local_c8;
  _Node_iterator_base<std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>,_false>
  local_c0;
  undefined1 in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff49;
  undefined8 local_a0 [6];
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  byte local_49;
  AlState *local_48;
  ulong local_40;
  __int_type_conflict local_38;
  __int_type_conflict local_18;
  memory_order local_10;
  int local_c;
  atomic<unsigned_long> *local_8;
  
  bind(in_RDI,in_ESI,in_RDX,in_ECX);
  std::unique_lock<std::mutex>::unique_lock
            (in_stack_fffffffffffffdb0,(mutex_type *)in_stack_fffffffffffffda8);
  std::atomic<bool>::operator=
            ((atomic<bool> *)in_stack_fffffffffffffdb0,
             SUB81((ulong)in_stack_fffffffffffffda8 >> 0x38,0));
  std::unique_lock<std::mutex>::~unique_lock(in_stack_fffffffffffffdb0);
  std::condition_variable::notify_all();
  do {
    bVar1 = std::atomic<bool>::load
                      (in_stack_fffffffffffffdb8,
                       (memory_order)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return;
    }
    paVar3 = &in_RDI->num_input_streams;
    local_c = 5;
    local_8 = paVar3;
    local_10 = std::operator&(memory_order_seq_cst,__memory_order_mask);
    if (local_c - 1U < 2) {
      local_18 = (paVar3->super___atomic_base<unsigned_long>)._M_i;
    }
    else if (local_c == 5) {
      local_18 = (paVar3->super___atomic_base<unsigned_long>)._M_i;
    }
    else {
      local_18 = (paVar3->super___atomic_base<unsigned_long>)._M_i;
    }
    local_38 = local_18;
    for (local_40 = 0; local_40 < local_38; local_40 = local_40 + 1) {
      local_48 = SPSCQueue<Al::internal::AlState_*>::peek
                           ((SPSCQueue<Al::internal::AlState_*> *)
                            CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
      if (local_48 != (AlState *)0x0) {
        local_49 = 0;
        iVar2 = (**(code **)(*(long *)local_48 + 0x28))();
        if (iVar2 == 0) {
          bVar1 = true;
          if (3 < in_RDI->num_bounded) {
            local_58 = (**(code **)(*(long *)local_48 + 0x20))();
            sVar5 = std::
                    unordered_map<void_*,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>_>_>
                    ::count((unordered_map<void_*,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>_>_>
                             *)in_stack_fffffffffffffdb0,(key_type *)in_stack_fffffffffffffda8);
            bVar1 = true;
            if (sVar5 != 0) {
              local_60 = (**(code **)(*(long *)local_48 + 0x20))();
              std::
              unordered_map<void_*,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>_>_>
              ::operator[]((unordered_map<void_*,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>_>_>
                            *)in_stack_fffffffffffffdb0,(key_type *)in_stack_fffffffffffffda8);
              this_00 = std::
                        array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>
                        ::operator[]((array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>
                                      *)in_stack_fffffffffffffdb0,
                                     (size_type)in_stack_fffffffffffffda8);
              sVar4 = std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>
                      ::size(this_00);
              bVar1 = sVar4 == 0;
            }
          }
          if (bVar1) {
            in_RDI->num_bounded = in_RDI->num_bounded + 1;
            local_49 = 1;
          }
        }
        else if (iVar2 == 1) {
          local_49 = 1;
        }
        if ((local_49 & 1) != 0) {
          local_68 = (**(code **)(*(long *)local_48 + 0x20))();
          sVar5 = std::
                  unordered_map<void_*,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>_>_>
                  ::count((unordered_map<void_*,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>_>_>
                           *)in_stack_fffffffffffffdb0,(key_type *)in_stack_fffffffffffffda8);
          if (sVar5 == 0) {
            local_70 = (**(code **)(*(long *)local_48 + 0x20))();
            local_1f0 = local_a0;
            do {
              memset(local_1f0,0,0x18);
              std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>::vector
                        ((vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>
                          *)0x136add);
              local_1f0 = local_1f0 + 3;
            } while (local_1f0 != &local_70);
            pVar8 = std::
                    unordered_map<void*,std::array<std::vector<Al::internal::AlState*,std::allocator<Al::internal::AlState*>>,2ul>,std::hash<void*>,std::equal_to<void*>,std::allocator<std::pair<void*const,std::array<std::vector<Al::internal::AlState*,std::allocator<Al::internal::AlState*>>,2ul>>>>
                    ::
                    emplace<void*,std::array<std::vector<Al::internal::AlState*,std::allocator<Al::internal::AlState*>>,2ul>>
                              (in_stack_fffffffffffffdc0,(void **)in_stack_fffffffffffffdb8,
                               (array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>
                                *)in_stack_fffffffffffffdb0);
            in_stack_fffffffffffffdf0._M_cur =
                 (__node_type *)
                 pVar8.first.
                 super__Node_iterator_base<std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>,_false>
                 ._M_cur;
            in_stack_fffffffffffffdef = pVar8.second;
            local_c0._M_cur = in_stack_fffffffffffffdf0._M_cur;
            in_stack_ffffffffffffff48 = in_stack_fffffffffffffdef;
            std::
            array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>
            ::~array((array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>
                      *)in_stack_fffffffffffffdc0);
          }
          in_stack_fffffffffffffde0 = (allocator<char> *)&in_RDI->run_queues;
          local_c8 = (**(code **)(*(long *)local_48 + 0x20))();
          std::
          unordered_map<void_*,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>_>_>
          ::operator[]((unordered_map<void_*,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>_>_>
                        *)in_stack_fffffffffffffdb0,(key_type *)in_stack_fffffffffffffda8);
          std::
          array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>
          ::operator[]((array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>
                        *)in_stack_fffffffffffffdb0,(size_type)in_stack_fffffffffffffda8);
          std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>::push_back
                    ((vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_> *)
                     in_stack_fffffffffffffdc0,(value_type *)in_stack_fffffffffffffdb8);
          (**(code **)(*(long *)local_48 + 0x10))();
          SPSCQueue<Al::internal::AlState_*>::pop_always
                    ((SPSCQueue<Al::internal::AlState_*> *)
                     CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
        }
      }
    }
    local_d0 = &in_RDI->run_queues;
    local_d8._M_cur =
         (__node_type *)
         std::
         unordered_map<void_*,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>_>_>
         ::begin(in_stack_fffffffffffffda8);
    local_e0._M_cur =
         (__node_type *)
         std::
         unordered_map<void_*,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>_>_>
         ::end(in_stack_fffffffffffffda8);
    while (bVar1 = std::__detail::operator!=(&local_d8,&local_e0), bVar1) {
      local_e8 = std::__detail::
                 _Node_iterator<std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>,_false,_false>
                 ::operator*((_Node_iterator<std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>,_false,_false>
                              *)0x136c77);
      local_f0 = &local_e8->second;
      for (local_f8 = 0; local_f8 < 2; local_f8 = local_f8 + 1) {
        std::
        array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>::
        operator[]((array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>
                    *)in_stack_fffffffffffffdb0,(size_type)in_stack_fffffffffffffda8);
        local_100._M_current =
             (AlState **)
             std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>::begin
                       ((vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_> *
                        )in_stack_fffffffffffffda8);
        while( true ) {
          std::
          array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>
          ::operator[]((array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>
                        *)in_stack_fffffffffffffdb0,(size_type)in_stack_fffffffffffffda8);
          std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>::end
                    ((vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_> *)
                     in_stack_fffffffffffffda8);
          bVar1 = __gnu_cxx::operator!=
                            ((__normal_iterator<Al::internal::AlState_**,_std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>_>
                              *)in_stack_fffffffffffffdb0,
                             (__normal_iterator<Al::internal::AlState_**,_std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>_>
                              *)in_stack_fffffffffffffda8);
          if (!bVar1) break;
          ppAVar7 = __gnu_cxx::
                    __normal_iterator<Al::internal::AlState_**,_std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>_>
                    ::operator*(&local_100);
          __position._M_current = (AlState **)*ppAVar7;
          if (((byte)*(AlState *)((long)__position._M_current + 9) & 1) == 0) {
            in_stack_fffffffffffffddc = (**(code **)((long)*__position._M_current + 0x18))();
            if (in_stack_fffffffffffffddc == 0) {
              __gnu_cxx::
              __normal_iterator<Al::internal::AlState_**,_std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>_>
              ::operator++(&local_100);
            }
            else if (in_stack_fffffffffffffddc == 1) {
              std::
              array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>
              ::operator[]((array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>
                            *)in_stack_fffffffffffffdb0,(size_type)in_stack_fffffffffffffda8);
              std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>::begin
                        ((vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>
                          *)in_stack_fffffffffffffda8);
              bVar1 = __gnu_cxx::operator==
                                ((__normal_iterator<Al::internal::AlState_**,_std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>_>
                                  *)in_stack_fffffffffffffdb0,
                                 (__normal_iterator<Al::internal::AlState_**,_std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>_>
                                  *)in_stack_fffffffffffffda8);
              if (bVar1) {
                std::
                array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>
                ::operator[]((array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>
                              *)in_stack_fffffffffffffdb0,(size_type)in_stack_fffffffffffffda8);
                std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>::
                push_back((vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>
                           *)in_stack_fffffffffffffdc0,(value_type *)in_stack_fffffffffffffdb8);
                std::
                array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>
                ::operator[]((array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>
                              *)in_stack_fffffffffffffdb0,(size_type)in_stack_fffffffffffffda8);
                __gnu_cxx::
                __normal_iterator<Al::internal::AlState*const*,std::vector<Al::internal::AlState*,std::allocator<Al::internal::AlState*>>>
                ::__normal_iterator<Al::internal::AlState**>
                          ((__normal_iterator<Al::internal::AlState_*const_*,_std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>_>
                            *)in_stack_fffffffffffffdb0,
                           (__normal_iterator<Al::internal::AlState_**,_std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>_>
                            *)in_stack_fffffffffffffda8);
                local_100._M_current =
                     (AlState **)
                     std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>
                     ::erase((vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>
                              *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdc8);
              }
              else {
                *(AlState *)((long)__position._M_current + 9) = (AlState)0x1;
                __gnu_cxx::
                __normal_iterator<Al::internal::AlState_**,_std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>_>
                ::operator++(&local_100);
              }
            }
            else {
              if (in_stack_fffffffffffffddc != 2) {
                local_182 = 1;
                uVar6 = __cxa_allocate_exception(0x70);
                build_string<char_const(&)[17]>
                          ((char (*) [17])
                           CONCAT71(in_stack_ffffffffffffff49,in_stack_ffffffffffffff48));
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffdf0._M_cur,
                           (char *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8),
                           in_stack_fffffffffffffde0);
                al_exception::al_exception
                          (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                           in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
                local_182 = 0;
                __cxa_throw(uVar6,&al_exception::typeinfo,al_exception::~al_exception);
              }
              iVar2 = (**(code **)((long)*__position._M_current + 0x28))();
              if (iVar2 == 0) {
                in_RDI->num_bounded = in_RDI->num_bounded - 1;
              }
              if ((AlState *)__position._M_current != (AlState *)0x0) {
                (**(code **)((long)*__position._M_current + 8))();
              }
              in_stack_fffffffffffffdc0 =
                   (unordered_map<void_*,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>_>_>
                    *)std::
                      array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>
                      ::operator[]((array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>
                                    *)in_stack_fffffffffffffdb0,(size_type)in_stack_fffffffffffffda8
                                  );
              __gnu_cxx::
              __normal_iterator<Al::internal::AlState*const*,std::vector<Al::internal::AlState*,std::allocator<Al::internal::AlState*>>>
              ::__normal_iterator<Al::internal::AlState**>
                        ((__normal_iterator<Al::internal::AlState_*const_*,_std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>_>
                          *)in_stack_fffffffffffffdb0,
                         (__normal_iterator<Al::internal::AlState_**,_std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>_>
                          *)in_stack_fffffffffffffda8);
              local_100._M_current =
                   (AlState **)
                   std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>::
                   erase((vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>
                          *)in_stack_fffffffffffffdc0,__position);
              in_stack_fffffffffffffdc8._M_current = __position._M_current;
            }
          }
          else {
            __gnu_cxx::
            __normal_iterator<Al::internal::AlState_**,_std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>_>
            ::operator++(&local_100);
          }
        }
        std::
        array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>::
        operator[]((array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>
                    *)in_stack_fffffffffffffdb0,(size_type)in_stack_fffffffffffffda8);
        local_190._M_current =
             (AlState **)
             std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>::begin
                       ((vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_> *
                        )in_stack_fffffffffffffda8);
        while( true ) {
          std::
          array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>
          ::operator[]((array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>
                        *)in_stack_fffffffffffffdb0,(size_type)in_stack_fffffffffffffda8);
          std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>::end
                    ((vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_> *)
                     in_stack_fffffffffffffda8);
          bVar1 = __gnu_cxx::operator!=
                            ((__normal_iterator<Al::internal::AlState_**,_std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>_>
                              *)in_stack_fffffffffffffdb0,
                             (__normal_iterator<Al::internal::AlState_**,_std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>_>
                              *)in_stack_fffffffffffffda8);
          if (!bVar1) break;
          ppAVar7 = __gnu_cxx::
                    __normal_iterator<Al::internal::AlState_**,_std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>_>
                    ::operator*(&local_190);
          if (((byte)(*ppAVar7)[9] & 1) == 0) break;
          (*ppAVar7)[9] = (AlState)0x0;
          std::
          array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>
          ::operator[]((array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>
                        *)in_stack_fffffffffffffdb0,(size_type)in_stack_fffffffffffffda8);
          std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>::push_back
                    ((vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_> *)
                     in_stack_fffffffffffffdc0,(value_type *)in_stack_fffffffffffffdb8);
          in_stack_fffffffffffffda8 =
               (unordered_map<void_*,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>_>_>
                *)std::
                  array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>
                  ::operator[]((array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>
                                *)in_stack_fffffffffffffdb0,(size_type)in_stack_fffffffffffffda8);
          __gnu_cxx::
          __normal_iterator<Al::internal::AlState*const*,std::vector<Al::internal::AlState*,std::allocator<Al::internal::AlState*>>>
          ::__normal_iterator<Al::internal::AlState**>
                    ((__normal_iterator<Al::internal::AlState_*const_*,_std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>_>
                      *)in_stack_fffffffffffffdb0,
                     (__normal_iterator<Al::internal::AlState_**,_std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>_>
                      *)in_stack_fffffffffffffda8);
          local_190._M_current =
               (AlState **)
               std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>::erase
                         ((vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>
                           *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdc8);
        }
      }
      std::__detail::
      _Node_iterator<std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>,_false,_false>
      ::operator++((_Node_iterator<std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>,_false,_false>
                    *)in_stack_fffffffffffffdb0);
    }
  } while( true );
}

Assistant:

void ProgressEngine::engine() {
#ifdef AL_HAS_CUDA
  // Set the current CUDA device for the thread.
  AL_CHECK_CUDA_NOSYNC(AlGpuSetDevice(cur_device.load()));
#endif
#ifdef AL_USE_HWLOC
  bind();
#endif
  // Notify the main thread we're now running.
  {
    std::unique_lock<std::mutex> lock(startup_mutex);
    started_flag = true;
  }
#ifdef AL_PE_START_ON_DEMAND
  startup_cv.notify_all();
#else
  startup_cv.notify_one();
#endif
  while (!stop_flag.load(std::memory_order_acquire)) {
    // Check for newly-submitted requests.
    size_t cur_input_streams = num_input_streams.load();
    for (size_t i = 0; i < cur_input_streams; ++i) {
      AlState* req = request_queues[i].q.peek();
      if (req != nullptr) {
        // Add to the correct run queue if one is available.
        bool do_start = false;
        switch (req->get_run_type()) {
        case RunType::bounded:
          // Move to the run queue if any of the following hold:
          //   1. num_bounded < AL_PE_NUM_CONCURRENT_OPS.
          //   2. The run_queue for this stream doesn't exist.
          //   3. The run_queue for this stream's first stage is empty.
          if (num_bounded < AL_PE_NUM_CONCURRENT_OPS
              || !run_queues.count(req->get_compute_stream())
              || !run_queues[req->get_compute_stream()][0].size()) {
            ++num_bounded;
            do_start = true;
          }
          break;
        case RunType::unbounded:
          do_start = true;
          break;
        }
        if (do_start) {
          // Add to end of first pipeline stage.
          // Create run queues if needed.
          if (!run_queues.count(req->get_compute_stream())) {
            run_queues.emplace(req->get_compute_stream(),
                               decltype(run_queues)::mapped_type{});
          }
          run_queues[req->get_compute_stream()][0].push_back(req);
          req->start();
#ifdef AL_DEBUG_HANG_CHECK
          req->start_time = get_time();
#endif
#ifdef AL_TRACE
          trace::record_pe_start(*req);
#endif
          request_queues[i].q.pop_always();
        }
      }
    }
    // Process one step of each in-progress request.
    for (auto&& stream_pipeline_pair : run_queues) {
      auto&& pipeline = stream_pipeline_pair.second;
      for (size_t stage = 0; stage < AL_PE_NUM_PIPELINE_STAGES; ++stage) {
        // Process this stage of the pipeline.
        for (auto i = pipeline[stage].begin(); i != pipeline[stage].end();) {
          AlState* req = *i;
          // Simply skip over paused states.
          if (req->paused_for_advance) {
            ++i;
          } else {
            PEAction action = req->step();
            switch (action) {
            case PEAction::cont:
              // Nothing to do here.
#ifdef AL_DEBUG_HANG_CHECK
              // Check whether we have hung.
              if (!req->hang_reported) {
                double t = get_time();
                if (t - req->start_time > 10.0 + world_comm->rank()) {
                  std::cout << world_comm->rank()
                            << ": Progress engine detected a possible hang"
                            << " state=" << req << " " << req->get_name()
                            << " compute_stream=" << req->get_compute_stream()
                            << " run_type="
                            << (req->get_run_type() == RunType::bounded ? "bounded" : "unbounded")
                            << std::endl;
                  req->hang_reported = true;
                }
              }
#endif
              ++i;
              break;
            case PEAction::advance:
#ifdef AL_DEBUG
              // Ensure we don't advance too far.
              if (stage + 1 >= AL_PE_NUM_PIPELINE_STAGES) {
                throw_al_exception("Trying to advance pipeline stage too far");
              }
#endif
              // Only move if this is the head of the pipeline stage.
              if (i == pipeline[stage].begin()) {
                pipeline[stage+1].push_back(req);
                i = pipeline[stage].erase(i);
              } else {
                req->paused_for_advance = true;
                ++i;
              }
              break;
            case PEAction::complete:
              if (req->get_run_type() == RunType::bounded) {
                --num_bounded;
              }
#ifdef AL_TRACE
              trace::record_pe_done(*req);
#endif
              delete req;
              i = pipeline[stage].erase(i);
              break;
            default:
              throw_al_exception("Unknown PEAction");
              break;
            }
          }
        }
        // Check whether we can advance paused states.
        for (auto i = pipeline[stage].begin(); i != pipeline[stage].end();) {
          AlState* req = *i;
          if (req->paused_for_advance) {
            // Move to the next stage.
            req->paused_for_advance = false;
            pipeline[stage+1].push_back(req);
            i = pipeline[stage].erase(i);
          } else {
            break;  // Nothing at the head to advance.
          }
        }
      }
    }
  }
}